

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void icons_to_property(Fl_RGB_Image **icons,int count,unsigned_long **property,size_t *len)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Fl_RGB_Image *pFVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  uint uVar14;
  unsigned_long uVar15;
  
  uVar5 = 0;
  uVar9 = (ulong)(uint)count;
  if (count < 1) {
    uVar9 = uVar5;
  }
  uVar7 = 0;
  for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
    uVar7 = uVar7 + (long)(icons[uVar5]->super_Fl_Image).h_ *
                    (long)(icons[uVar5]->super_Fl_Image).w_ + 2;
  }
  puVar6 = (unsigned_long *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
  uVar5 = 0;
  *property = puVar6;
  *len = uVar7;
  do {
    if (uVar5 == uVar9) {
      return;
    }
    pFVar4 = icons[uVar5];
    iVar2 = (pFVar4->super_Fl_Image).w_;
    *puVar6 = (long)iVar2;
    iVar8 = (pFVar4->super_Fl_Image).h_;
    puVar6[1] = (long)iVar8;
    iVar12 = (pFVar4->super_Fl_Image).ld_;
    if (iVar12 == 0) {
      lVar10 = 0;
    }
    else {
      lVar10 = (long)(iVar12 - (pFVar4->super_Fl_Image).d_ * iVar2);
    }
    puVar6 = puVar6 + 2;
    iVar11 = 0;
    iVar12 = 0;
    if (0 < iVar2) {
      iVar12 = iVar2;
    }
    pbVar13 = (byte *)*(pFVar4->super_Fl_Image).data_;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    for (; iVar2 = iVar12, iVar11 != iVar8; iVar11 = iVar11 + 1) {
      while (iVar2 != 0) {
        iVar3 = (pFVar4->super_Fl_Image).d_;
        switch(iVar3) {
        case 1:
          uVar14 = (uint)*pbVar13 * 0x10101;
          goto LAB_001df808;
        case 2:
          bVar1 = *pbVar13;
          uVar15 = (long)(int)((uint)pbVar13[1] << 0x18) | (ulong)bVar1 << 0x10 | (ulong)bVar1 << 8
                   | (ulong)bVar1;
          break;
        case 3:
          uVar14 = (uint)pbVar13[2] | (uint)pbVar13[1] << 8 | (uint)*pbVar13 << 0x10;
LAB_001df808:
          uVar15 = (ulong)uVar14 | 0xffffffffff000000;
          break;
        case 4:
          uVar15 = (ulong)pbVar13[2] |
                   (ulong)pbVar13[1] << 8 |
                   (long)(int)((uint)pbVar13[3] << 0x18) | (ulong)*pbVar13 << 0x10;
          break;
        default:
          goto switchD_001df7df_default;
        }
        *puVar6 = uVar15;
switchD_001df7df_default:
        pbVar13 = pbVar13 + iVar3;
        puVar6 = puVar6 + 1;
        iVar2 = iVar2 + -1;
      }
      pbVar13 = pbVar13 + lVar10;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void icons_to_property(const Fl_RGB_Image *icons[], int count,
                              unsigned long **property, size_t *len) {
  size_t sz;
  unsigned long *data;

  sz = 0;
  for (int i = 0;i < count;i++)
    sz += 2 + icons[i]->w() * icons[i]->h();

  // FIXME: Might want to sort the icons

  *property = data = new unsigned long[sz];
  *len = sz;

  for (int i = 0;i < count;i++) {
    const Fl_RGB_Image *image;

    image = icons[i];

    data[0] = image->w();
    data[1] = image->h();
    data += 2;

    const int extra_data = image->ld() ? (image->ld()-image->w()*image->d()) : 0;

    const uchar *in = (const uchar*)*image->data();
    for (int y = 0; y < image->h(); y++) {
      for (int x = 0; x < image->w(); x++) {
        switch (image->d()) {
        case 1:
          *data = ( 0xff<<24) | (in[0]<<16) | (in[0]<<8) | in[0];
          break;
        case 2:
          *data = (in[1]<<24) | (in[0]<<16) | (in[0]<<8) | in[0];
          break;
        case 3:
          *data = ( 0xff<<24) | (in[0]<<16) | (in[1]<<8) | in[2];
          break;
        case 4:
          *data = (in[3]<<24) | (in[0]<<16) | (in[1]<<8) | in[2];
          break;
        }
        in += image->d();
        data++;
      }
      in += extra_data;
    }
  }
}